

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_socket_action
                    (Curl_multi *multi,curl_socket_t s,int ev_bitmask,int *running_handles)

{
  CURLMcode CVar1;
  
  if (multi->in_callback == false) {
    CVar1 = multi_socket(multi,false,s,ev_bitmask,running_handles);
    if (CVar1 < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
  }
  else {
    CVar1 = CURLM_RECURSIVE_API_CALL;
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_socket_action(struct Curl_multi *multi, curl_socket_t s,
                                   int ev_bitmask, int *running_handles)
{
  CURLMcode result;
  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;
  result = multi_socket(multi, FALSE, s, ev_bitmask, running_handles);
  if(CURLM_OK >= result)
    update_timer(multi);
  return result;
}